

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

bool __thiscall Catch::WildcardPattern::matches(WildcardPattern *this,string *str)

{
  ReusableStringStream *pRVar1;
  long in_RDI;
  string *in_stack_fffffffffffffeb8;
  string *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  string *s;
  string *in_stack_fffffffffffffef0;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  SourceLineInfo local_e8 [4];
  string local_a8 [32];
  string local_88;
  string local_58;
  string local_38 [55];
  byte local_1;
  
  switch(*(undefined4 *)(in_RDI + 4)) {
  case 0:
    normaliseString((WildcardPattern *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8)
                    ,in_stack_fffffffffffffef0);
    local_1 = std::operator==(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    std::__cxx11::string::~string(local_38);
    break;
  case 1:
    normaliseString((WildcardPattern *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8)
                    ,&local_58);
    local_1 = endsWith(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    std::__cxx11::string::~string((string *)&local_58);
    break;
  case 2:
    s = &local_88;
    normaliseString((WildcardPattern *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8)
                    ,in_stack_fffffffffffffef0);
    local_1 = startsWith(s,in_stack_fffffffffffffed8);
    std::__cxx11::string::~string((string *)&local_88);
    break;
  case 3:
    normaliseString((WildcardPattern *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8)
                    ,in_stack_fffffffffffffef0);
    local_1 = contains(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    std::__cxx11::string::~string(local_a8);
    break;
  default:
    ReusableStringStream::ReusableStringStream((ReusableStringStream *)in_stack_fffffffffffffec0);
    SourceLineInfo::SourceLineInfo
              (local_e8,
               "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2v3_amalgamated/catch_amalgamated.cpp"
               ,0x1dc0);
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_fffffffffffffec0,
               (SourceLineInfo *)in_stack_fffffffffffffeb8);
    pRVar1 = ReusableStringStream::operator<<
                       ((ReusableStringStream *)in_stack_fffffffffffffec0,
                        (char (*) [26])in_stack_fffffffffffffeb8);
    pRVar1 = ReusableStringStream::operator<<(pRVar1,(char (*) [13])in_stack_fffffffffffffeb8);
    ReusableStringStream::str_abi_cxx11_(pRVar1);
    throw_logic_error(in_stack_fffffffffffffee0);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool WildcardPattern::matches( std::string const& str ) const {
        switch( m_wildcard ) {
            case NoWildcard:
                return m_pattern == normaliseString( str );
            case WildcardAtStart:
                return endsWith( normaliseString( str ), m_pattern );
            case WildcardAtEnd:
                return startsWith( normaliseString( str ), m_pattern );
            case WildcardAtBothEnds:
                return contains( normaliseString( str ), m_pattern );
            default:
                CATCH_INTERNAL_ERROR( "Unknown enum" );
        }
    }